

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::initialize<tinyusdz::Animatable<bool>>
          (optional<tinyusdz::Animatable<bool>> *this,Animatable<bool> *value)

{
  if (*this != (optional<tinyusdz::Animatable<bool>>)0x1) {
    this[10] = (optional<tinyusdz::Animatable<bool>>)value->_blocked;
    *(undefined2 *)(this + 8) = *(undefined2 *)value;
    *(pointer *)(this + 0x10) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x18) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x20) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0x28] = (optional<tinyusdz::Animatable<bool>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<bool>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::initialize(V &&) [T = tinyusdz::Animatable<bool>, V = tinyusdz::Animatable<bool>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }